

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestOstreamBuffer.cpp
# Opt level: O1

string * __thiscall
anon_unknown.dwarf_39e2cc::TestcaseBase::toString<double>
          (string *__return_storage_ptr__,TestcaseBase *this,double t)

{
  binlog::detail::OstreamBuffer::operator<<(&this->buf,t);
  binlog::detail::OstreamBuffer::flush(&this->buf);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringbuf::str((string *)&this->field_0x8);
  return __return_storage_ptr__;
}

Assistant:

std::string toString(T t)
  {
    buf << t;
    std::string s = result();
    str.str({}); // clear ostream
    return s;
  }